

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

void _run_all<directed_flag_complex_computer::directed_flag_complex_computer_t>
               (bool full,bool in_memory)

{
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<unsigned_long> __l_01;
  initializer_list<unsigned_long> __l_02;
  initializer_list<unsigned_long> __l_03;
  initializer_list<unsigned_long> __l_04;
  initializer_list<unsigned_long> __l_05;
  initializer_list<unsigned_long> __l_06;
  initializer_list<unsigned_long> __l_07;
  initializer_list<unsigned_long> __l_08;
  initializer_list<unsigned_long> __l_09;
  initializer_list<unsigned_long> __l_10;
  initializer_list<unsigned_long> __l_11;
  initializer_list<unsigned_long> __l_12;
  initializer_list<unsigned_long> __l_13;
  initializer_list<unsigned_long> __l_14;
  initializer_list<unsigned_long> __l_15;
  initializer_list<unsigned_long> __l_16;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  bool bVar1;
  logic_error *this;
  ostream *poVar2;
  byte in_SIL;
  byte in_DIL;
  string expected_file_content;
  string file_content;
  ifstream t;
  char *file_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffefc8;
  allocator *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffefd0;
  istream_type *in_stack_ffffffffffffefd8;
  istreambuf_iterator<char,_std::char_traits<char>_> *in_stack_ffffffffffffefe0;
  allocator *this_00;
  allocator_type *in_stack_ffffffffffffeff8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff000;
  allocator<char> *in_stack_fffffffffffff008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff010;
  streambuf_type *in_stack_fffffffffffff018;
  undefined8 in_stack_fffffffffffff020;
  streambuf_type *in_stack_fffffffffffff028;
  undefined8 in_stack_fffffffffffff030;
  allocator local_e11;
  string local_e10 [40];
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  char *pcStack_da0;
  undefined8 *local_d98;
  undefined8 local_d90;
  allocator local_d69;
  string local_d68 [39];
  allocator local_d41;
  string local_d40 [40];
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 *local_cf0;
  undefined8 local_ce8;
  allocator local_cc1;
  string local_cc0 [39];
  allocator local_c99;
  string local_c98 [39];
  allocator<char> local_c71 [33];
  string local_c50 [32];
  undefined1 local_c30 [208];
  string *in_stack_fffffffffffff4a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff4a8;
  string *in_stack_fffffffffffff4b0;
  allocator local_a21;
  string local_a20 [40];
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 *local_9e0;
  undefined8 local_9d8;
  allocator local_9b1;
  string local_9b0 [32];
  char *local_990;
  allocator local_981;
  string local_980 [40];
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 *local_918;
  undefined8 local_910;
  allocator local_8e9;
  string local_8e8 [39];
  allocator local_8c1;
  string local_8c0 [40];
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 *local_868;
  undefined8 local_860;
  allocator local_839;
  string local_838 [39];
  allocator local_811;
  string local_810 [40];
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 *local_7c8;
  undefined8 local_7c0;
  allocator local_799;
  string local_798 [39];
  allocator local_771;
  string local_770 [40];
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 *local_728;
  undefined8 local_720;
  allocator local_6f9;
  string local_6f8 [39];
  allocator local_6d1;
  string local_6d0 [40];
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 *local_688;
  undefined8 local_680;
  allocator local_659;
  string local_658 [39];
  allocator local_631;
  string local_630 [40];
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 *local_5e8;
  undefined8 local_5e0;
  allocator local_5b9;
  string local_5b8 [39];
  allocator local_591;
  string local_590 [40];
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 *local_548;
  undefined8 local_540;
  allocator local_519;
  string local_518 [39];
  allocator local_4f1;
  string local_4f0 [40];
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 *local_4a8;
  undefined8 local_4a0;
  allocator local_479;
  string local_478 [39];
  allocator local_451;
  string local_450 [40];
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 *local_408;
  undefined8 local_400;
  allocator local_3d9;
  string local_3d8 [39];
  allocator local_3b1;
  string local_3b0 [40];
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 *local_368;
  undefined8 local_360;
  allocator local_339;
  string local_338 [39];
  allocator local_311;
  string local_310 [40];
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 *local_2c8;
  undefined8 local_2c0;
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [40];
  undefined8 local_248;
  undefined8 local_240;
  undefined8 *local_238;
  undefined8 local_230;
  allocator local_209;
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [40];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 *local_198;
  undefined8 local_190;
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [40];
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 *local_f8;
  undefined8 local_f0;
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [40];
  undefined8 local_78;
  undefined8 local_70;
  undefined8 *local_68;
  undefined8 local_60;
  allocator local_29;
  string local_28 [38];
  byte local_2;
  byte local_1;
  
  local_1 = in_DIL & 1;
  local_2 = in_SIL & 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"../../test/d2.flag",&local_29);
  local_78 = 1;
  local_70 = 1;
  local_68 = &local_78;
  local_60 = 2;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x192c6c);
  __l._M_len = (size_type)in_stack_fffffffffffff010;
  __l._M_array = (iterator)in_stack_fffffffffffff008;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffff000,__l,in_stack_ffffffffffffeff8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"",&local_a1);
  compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
            (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffefe0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x192d19);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"../../test/a.flag",&local_c9);
  local_118 = 1;
  uStack_110 = 2;
  local_108 = 0;
  local_f8 = &local_118;
  local_f0 = 3;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x192db2);
  __l_00._M_len = (size_type)in_stack_fffffffffffff010;
  __l_00._M_array = (iterator)in_stack_fffffffffffff008;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffff000,__l_00,in_stack_ffffffffffffeff8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"",&local_141);
  compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
            (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffefe0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x192e5f);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"../../test/b.flag",&local_169);
  local_1b8 = 1;
  uStack_1b0 = 0;
  local_1a8 = 0;
  local_198 = &local_1b8;
  local_190 = 3;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x192ef8);
  __l_01._M_len = (size_type)in_stack_fffffffffffff010;
  __l_01._M_array = (iterator)in_stack_fffffffffffff008;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffff000,__l_01,in_stack_ffffffffffffeff8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"",&local_1e1);
  compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
            (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffefe0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x192fa5);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"../../test/c.flag",&local_209);
  local_248 = 1;
  local_240 = 5;
  local_238 = &local_248;
  local_230 = 2;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x19303b);
  __l_02._M_len = (size_type)in_stack_fffffffffffff010;
  __l_02._M_array = (iterator)in_stack_fffffffffffff008;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffff000,__l_02,in_stack_ffffffffffffeff8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"",&local_271);
  compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
            (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffefe0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1930e8);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"../../test/d.flag",&local_299);
  local_2e8 = 1;
  uStack_2e0 = 0;
  local_2d8 = 1;
  local_2c8 = &local_2e8;
  local_2c0 = 3;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x193181);
  __l_03._M_len = (size_type)in_stack_fffffffffffff010;
  __l_03._M_array = (iterator)in_stack_fffffffffffff008;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffff000,__l_03,in_stack_ffffffffffffeff8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_310,"",&local_311);
  compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
            (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffefe0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x19322e);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"../../test/e.flag",&local_339);
  local_378 = 0;
  uStack_370 = 0;
  local_388 = 1;
  uStack_380 = 0;
  local_368 = &local_388;
  local_360 = 4;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1932dd);
  __l_04._M_len = (size_type)in_stack_fffffffffffff010;
  __l_04._M_array = (iterator)in_stack_fffffffffffff008;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffff000,__l_04,in_stack_ffffffffffffeff8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"",&local_3b1);
  compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
            (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffefe0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x19338a);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d8,"../../test/f.flag",&local_3d9);
  local_428 = 1;
  uStack_420 = 0;
  local_418 = 0;
  local_408 = &local_428;
  local_400 = 3;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x193423);
  __l_05._M_len = (size_type)in_stack_fffffffffffff010;
  __l_05._M_array = (iterator)in_stack_fffffffffffff008;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffff000,__l_05,in_stack_ffffffffffffeff8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_450,"",&local_451);
  compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
            (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffefe0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1934d0);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_478,"../../test/d3.flag",&local_479);
  local_4c8 = 1;
  uStack_4c0 = 0;
  local_4b8 = 2;
  local_4a8 = &local_4c8;
  local_4a0 = 3;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x193569);
  __l_06._M_len = (size_type)in_stack_fffffffffffff010;
  __l_06._M_array = (iterator)in_stack_fffffffffffff008;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffff000,__l_06,in_stack_ffffffffffffeff8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f0,"",&local_4f1);
  compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
            (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
  std::__cxx11::string::~string(local_4f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffefe0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x193616);
  std::__cxx11::string::~string(local_478);
  std::allocator<char>::~allocator((allocator<char> *)&local_479);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"../../test/d3-allzero.flag",&local_519);
  local_568 = 1;
  uStack_560 = 0;
  local_558 = 2;
  local_548 = &local_568;
  local_540 = 3;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1936af);
  __l_07._M_len = (size_type)in_stack_fffffffffffff010;
  __l_07._M_array = (iterator)in_stack_fffffffffffff008;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffff000,__l_07,in_stack_ffffffffffffeff8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_590,"",&local_591);
  compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
            (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
  std::__cxx11::string::~string(local_590);
  std::allocator<char>::~allocator((allocator<char> *)&local_591);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffefe0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x19375c);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5b8,"../../test/double-d3.flag",&local_5b9);
  local_608 = 1;
  uStack_600 = 0;
  local_5f8 = 5;
  local_5e8 = &local_608;
  local_5e0 = 3;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1937f5);
  __l_08._M_len = (size_type)in_stack_fffffffffffff010;
  __l_08._M_array = (iterator)in_stack_fffffffffffff008;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffff000,__l_08,in_stack_ffffffffffffeff8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_630,"",&local_631);
  compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
            (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
  std::__cxx11::string::~string(local_630);
  std::allocator<char>::~allocator((allocator<char> *)&local_631);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffefe0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1938a2);
  std::__cxx11::string::~string(local_5b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_658,"../../test/double-d3-allzero.flag",&local_659);
  local_6a8 = 1;
  uStack_6a0 = 0;
  local_698 = 5;
  local_688 = &local_6a8;
  local_680 = 3;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x19393b);
  __l_09._M_len = (size_type)in_stack_fffffffffffff010;
  __l_09._M_array = (iterator)in_stack_fffffffffffff008;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffff000,__l_09,in_stack_ffffffffffffeff8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6d0,"",&local_6d1);
  compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
            (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
  std::__cxx11::string::~string(local_6d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffefe0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1939e8);
  std::__cxx11::string::~string(local_658);
  std::allocator<char>::~allocator((allocator<char> *)&local_659);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6f8,"../../test/d4.flag",&local_6f9);
  local_738 = 0;
  uStack_730 = 9;
  local_748 = 1;
  uStack_740 = 0;
  local_728 = &local_748;
  local_720 = 4;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x193a84);
  __l_10._M_len = (size_type)in_stack_fffffffffffff010;
  __l_10._M_array = (iterator)in_stack_fffffffffffff008;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffff000,__l_10,in_stack_ffffffffffffeff8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_770,"",&local_771);
  compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
            (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
  std::__cxx11::string::~string(local_770);
  std::allocator<char>::~allocator((allocator<char> *)&local_771);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffefe0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x193b31);
  std::__cxx11::string::~string(local_6f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_798,"../../test/d4-allzero.flag",&local_799);
  local_7d8 = 0;
  uStack_7d0 = 9;
  local_7e8 = 1;
  uStack_7e0 = 0;
  local_7c8 = &local_7e8;
  local_7c0 = 4;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x193bcd);
  __l_11._M_len = (size_type)in_stack_fffffffffffff010;
  __l_11._M_array = (iterator)in_stack_fffffffffffff008;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffff000,__l_11,in_stack_ffffffffffffeff8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_810,"",&local_811);
  compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
            (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
  std::__cxx11::string::~string(local_810);
  std::allocator<char>::~allocator((allocator<char> *)&local_811);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffefe0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x193c7a);
  std::__cxx11::string::~string(local_798);
  std::allocator<char>::~allocator((allocator<char> *)&local_799);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_838,"../../test/d5.flag",&local_839);
  local_888 = 0;
  uStack_880 = 0;
  local_898 = 1;
  uStack_890 = 0;
  local_878 = 0x2c;
  local_868 = &local_898;
  local_860 = 5;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x193d22);
  __l_12._M_len = (size_type)in_stack_fffffffffffff010;
  __l_12._M_array = (iterator)in_stack_fffffffffffff008;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffff000,__l_12,in_stack_ffffffffffffeff8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8c0,"",&local_8c1);
  compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
            (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
  std::__cxx11::string::~string(local_8c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8c1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffefe0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x193dcf);
  std::__cxx11::string::~string(local_838);
  std::allocator<char>::~allocator((allocator<char> *)&local_839);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8e8,"../../test/d7.flag",&local_8e9);
  local_938 = 0;
  uStack_930 = 0;
  local_948 = 0;
  uStack_940 = 0;
  local_958 = 1;
  uStack_950 = 0;
  local_928 = 0x73e;
  local_918 = &local_958;
  local_910 = 7;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x193e86);
  __l_13._M_len = (size_type)in_stack_fffffffffffff010;
  __l_13._M_array = (iterator)in_stack_fffffffffffff008;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffff000,__l_13,in_stack_ffffffffffffeff8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_980,"",&local_981);
  compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
            (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
  std::__cxx11::string::~string(local_980);
  std::allocator<char>::~allocator((allocator<char> *)&local_981);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffefe0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x193f33);
  std::__cxx11::string::~string(local_8e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8e9);
  if ((local_1 & 1) != 0) {
    local_990 = "../flagser_tmp";
    remove("../flagser_tmp");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_9b0,"../../test/a.flag",&local_9b1);
    local_9f8 = 1;
    uStack_9f0 = 2;
    local_9e8 = 0;
    local_9e0 = &local_9f8;
    local_9d8 = 3;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x193fee);
    __l_14._M_len = (size_type)in_stack_fffffffffffff010;
    __l_14._M_array = (iterator)in_stack_fffffffffffff008;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (in_stack_fffffffffffff000,__l_14,in_stack_ffffffffffffeff8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a20,"../flagser_tmp",&local_a21);
    compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
              (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
    std::__cxx11::string::~string(local_a20);
    std::allocator<char>::~allocator((allocator<char> *)&local_a21);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffefe0);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x19409b);
    std::__cxx11::string::~string(local_9b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_9b1);
    std::ifstream::ifstream(local_c30,"../flagser_tmp",_S_in);
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              (in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              ((istreambuf_iterator<char,_std::char_traits<char>_> *)in_stack_ffffffffffffefd0);
    std::allocator<char>::allocator();
    __beg._8_8_ = in_stack_fffffffffffff030;
    __beg._M_sbuf = in_stack_fffffffffffff028;
    __end._8_8_ = in_stack_fffffffffffff020;
    __end._M_sbuf = in_stack_fffffffffffff018;
    std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
              (in_stack_fffffffffffff010,__beg,__end,in_stack_fffffffffffff008);
    std::allocator<char>::~allocator(local_c71);
    remove("../flagser_tmp");
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_c98,
               "# persistence intervals in dimension 0\n [0, )\n# persistence intervals in dimension 1\n [0, )\n [0, )\n# persistence intervals in dimension 2\n\nThe remaining homology groups are trivial.\n\n# Euler characteristic: -1\n\n# Betti numbers:\n#\t\tdim H_0 = 1\n#\t\tdim H_1 = 2\n#\t\tdim H_2 = 0\n\n# Cell counts:\n#\t\tdim C_0 = 5\n#\t\tdim C_1 = 7\n#\t\tdim C_2 = 1\n#\t\tdim C_3 = 0\n"
               ,&local_c99);
    std::allocator<char>::~allocator((allocator<char> *)&local_c99);
    bVar1 = std::operator!=(in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"The file content differed!");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = (ostream *)
               std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<(poVar2,"*** EXPECTED ***");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<(poVar2,local_c98);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = (ostream *)
               std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<(poVar2,"*** GOT ***");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<(poVar2,local_c50);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this,"The file content differed.");
      __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Running extensive tests, this might take a while.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    if ((local_2 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_cc0,"../../test/medium-test-data.flag",&local_cc1);
      local_d08 = 0x17a;
      uStack_d00 = 0;
      local_d18 = 0x379d;
      uStack_d10 = 0x9a35;
      local_cf0 = &local_d18;
      local_ce8 = 4;
      std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x194f15);
      __l_15._M_len = (size_type)in_stack_fffffffffffff010;
      __l_15._M_array = (iterator)in_stack_fffffffffffff008;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (in_stack_fffffffffffff000,__l_15,(allocator_type *)poVar2);
      this_00 = &local_d41;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d40,"",this_00);
      compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
                (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
      std::__cxx11::string::~string(local_d40);
      std::allocator<char>::~allocator((allocator<char> *)&local_d41);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
      std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x194fb9);
      std::__cxx11::string::~string(local_cc0);
      std::allocator<char>::~allocator((allocator<char> *)&local_cc1);
      paVar3 = &local_d69;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d68,"../../test/d10.flag",paVar3);
      local_da8 = 0;
      pcStack_da0 = "3new_allocatorI7entry_tE11_M_max_sizeEv";
      local_db8 = 0;
      uStack_db0 = 0;
      local_dc8 = 0;
      uStack_dc0 = 0;
      local_dd8 = 0;
      uStack_dd0 = 0;
      local_de8 = 1;
      uStack_de0 = 0;
      local_d98 = &local_de8;
      local_d90 = 10;
      std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1950a4);
      __l_16._M_len = (size_type)in_stack_fffffffffffff010;
      __l_16._M_array = (iterator)in_stack_fffffffffffff008;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (in_stack_fffffffffffff000,__l_16,(allocator_type *)poVar2);
      paVar3 = &local_e11;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e10,"",paVar3);
      compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
                (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
      std::__cxx11::string::~string(local_e10);
      std::allocator<char>::~allocator((allocator<char> *)&local_e11);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
      std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x195146);
      std::__cxx11::string::~string(local_d68);
      std::allocator<char>::~allocator((allocator<char> *)&local_d69);
    }
    std::__cxx11::string::~string(local_c98);
    std::__cxx11::string::~string(local_c50);
    std::ifstream::~ifstream(local_c30);
  }
  return;
}

Assistant:

void _run_all(bool full = false, bool in_memory = false) {
	compute<dfc>("../../test/d2.flag", {{1ul, 1ul}});
	compute<dfc>("../../test/a.flag", {{1ul, 2ul, 0ul}});
	compute<dfc>("../../test/b.flag", {{1ul, 0ul, 0ul}});
	compute<dfc>("../../test/c.flag", {{1ul, 5ul}});
	compute<dfc>("../../test/d.flag", {{1ul, 0ul, 1ul}});
	compute<dfc>("../../test/e.flag", {{1ul, 0ul, 0ul, 0ul}});
	compute<dfc>("../../test/f.flag", {{1ul, 0ul, 0ul}});
	compute<dfc>("../../test/d3.flag", {{1ul, 0ul, 2ul}});
	compute<dfc>("../../test/d3-allzero.flag", {{1ul, 0ul, 2ul}});
	compute<dfc>("../../test/double-d3.flag", {{1, 0, 5}});
	compute<dfc>("../../test/double-d3-allzero.flag", {{1, 0, 5}});
	compute<dfc>("../../test/d4.flag", {{1, 0, 0, 9}});
	compute<dfc>("../../test/d4-allzero.flag", {{1, 0, 0, 9}});
	compute<dfc>("../../test/d5.flag", {{1, 0, 0, 0, 44}});
	compute<dfc>("../../test/d7.flag", {{1, 0, 0, 0, 0, 0, 1854}});

	if (full) {
		const auto file_path = "../flagser_tmp";
		std::remove(file_path);
                compute<dfc>("../../test/a.flag", {{1ul, 2ul, 0ul}}, file_path);

		// Check that the file has the right content
		std::ifstream t(file_path);
		std::string file_content((std::istreambuf_iterator<char>(t)), std::istreambuf_iterator<char>());
		std::remove(file_path);

		std::string expected_file_content =
		    "# persistence intervals in dimension 0\n [0, )\n# persistence intervals in dimension 1\n [0, )\n [0, )\n# "
		    "persistence intervals in dimension 2\n\nThe remaining homology groups are trivial.\n\n# Euler "
		    "characteristic: -1\n\n# Betti numbers:\n#\t\tdim H_0 = 1\n#\t\tdim H_1 = 2\n#\t\tdim H_2 = 0\n\n# Cell "
		    "counts:\n#\t\tdim C_0 = 5\n#\t\tdim C_1 = 7\n#\t\tdim C_2 = 1\n#\t\tdim C_3 = 0\n";

		if (file_content != expected_file_content) {
			std::cerr << "The file content differed!" << std::endl;
			std::cerr << std::endl << "*** EXPECTED ***" << std::endl << expected_file_content << std::endl;
			std::cerr << std::endl << "*** GOT ***" << std::endl << file_content << std::endl;
			throw std::logic_error("The file content differed.");
		}

#ifdef NDEBUG
		std::cout << "Running extensive tests, this might take a while." << std::endl;
		if (in_memory) {
		        compute<dfc>("../../test/medium-test-data.flag", {{14237, 39477, 378, 0}});
			compute<dfc>("../../test/d10.flag", {{1, 0, 0, 0, 0, 0, 0, 0, 0, 1334961}});
		}
#else
		std::cout << "Skipping extensive tests." << std::endl;
#endif
	}
}